

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  int *piVar3;
  int *piVar4;
  Module *pMVar5;
  long *plVar6;
  undefined8 uVar7;
  int *piVar8;
  pointer *__ptr;
  char *format;
  long lVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  bool bVar15;
  undefined1 local_68 [16];
  undefined1 local_58 [40];
  
  if (1000 < param_count) {
    format = "FuncType param count exceeds maximum value";
LAB_0012f450:
    PrintError(this,format);
    return (Result)Error;
  }
  if (1000 < result_count) {
    format = "FuncType result count exceeds maximum value";
    goto LAB_0012f450;
  }
  local_68._8_8_ = this;
  GetLocation((Location *)(local_58 + 8),this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_68);
  std::make_unique<wabt::FuncType>();
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(local_58._8_8_ + 0x50),param_types,
             param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)(local_58._8_8_ + 0x68),result_types,
             result_types + result_count);
  uVar7 = local_58._8_8_;
  piVar8 = *(int **)(local_58._8_8_ + 0x50);
  piVar3 = *(int **)(local_58._8_8_ + 0x58);
  lVar9 = (long)piVar3 - (long)piVar8;
  lVar10 = lVar9 >> 5;
  piVar11 = piVar8;
  lVar12 = lVar9;
  for (lVar13 = lVar10; 0 < lVar13; lVar13 = lVar13 + -1) {
    if (*piVar11 == -5) goto LAB_0012f56d;
    if (piVar11[2] == -5) {
      piVar11 = piVar11 + 2;
      goto LAB_0012f56d;
    }
    if (piVar11[4] == -5) {
      piVar11 = piVar11 + 4;
      goto LAB_0012f56d;
    }
    if (piVar11[6] == -5) {
      piVar11 = piVar11 + 6;
      goto LAB_0012f56d;
    }
    piVar11 = piVar11 + 8;
    lVar12 = lVar12 + -0x20;
  }
  lVar12 = lVar12 >> 3;
  if (lVar12 == 1) {
LAB_0012f551:
    if (*piVar11 != -5) {
      piVar11 = piVar3;
    }
LAB_0012f56d:
    bVar15 = true;
    if (piVar11 == piVar3) goto LAB_0012f579;
  }
  else {
    if (lVar12 == 2) {
LAB_0012f545:
      if (*piVar11 != -5) {
        piVar11 = piVar11 + 2;
        goto LAB_0012f551;
      }
      goto LAB_0012f56d;
    }
    if (lVar12 == 3) {
      if (*piVar11 != -5) {
        piVar11 = piVar11 + 2;
        goto LAB_0012f545;
      }
      goto LAB_0012f56d;
    }
LAB_0012f579:
    piVar11 = *(int **)(local_58._8_8_ + 0x68);
    piVar4 = *(int **)(local_58._8_8_ + 0x70);
    lVar12 = (long)piVar4 - (long)piVar11;
    for (lVar13 = lVar12 >> 5; 0 < lVar13; lVar13 = lVar13 + -1) {
      piVar14 = piVar11;
      if (*piVar11 == -5) goto LAB_0012f613;
      if (piVar11[2] == -5) {
        piVar14 = piVar11 + 2;
        goto LAB_0012f613;
      }
      if (piVar11[4] == -5) {
        piVar14 = piVar11 + 4;
        goto LAB_0012f613;
      }
      if (piVar11[6] == -5) {
        piVar14 = piVar11 + 6;
        goto LAB_0012f613;
      }
      piVar11 = piVar11 + 8;
      lVar12 = lVar12 + -0x20;
    }
    lVar12 = lVar12 >> 3;
    if (lVar12 == 1) {
LAB_0012f5f4:
      piVar14 = piVar11;
      if (*piVar11 != -5) {
        piVar14 = piVar4;
      }
    }
    else if (lVar12 == 2) {
LAB_0012f5e8:
      piVar14 = piVar11;
      if (*piVar11 != -5) {
        piVar11 = piVar11 + 2;
        goto LAB_0012f5f4;
      }
    }
    else {
      piVar14 = piVar4;
      if ((lVar12 == 3) && (piVar14 = piVar11, *piVar11 != -5)) {
        piVar11 = piVar11 + 2;
        goto LAB_0012f5e8;
      }
    }
LAB_0012f613:
    bVar15 = piVar14 != piVar4;
  }
  pMVar5 = *(Module **)(local_68._8_8_ + 0x18);
  paVar1 = &pMVar5->features_used;
  paVar1->simd = (bool)(paVar1->simd | bVar15);
  for (; 0 < lVar10; lVar10 = lVar10 + -1) {
    if (*piVar8 == -0x17) goto LAB_0012f694;
    if (piVar8[2] == -0x17) {
      piVar8 = piVar8 + 2;
      goto LAB_0012f694;
    }
    if (piVar8[4] == -0x17) {
      piVar8 = piVar8 + 4;
      goto LAB_0012f694;
    }
    if (piVar8[6] == -0x17) {
      piVar8 = piVar8 + 6;
      goto LAB_0012f694;
    }
    piVar8 = piVar8 + 8;
    lVar9 = lVar9 + -0x20;
  }
  lVar9 = lVar9 >> 3;
  if (lVar9 == 1) {
LAB_0012f67b:
    if (*piVar8 != -0x17) {
      piVar8 = piVar3;
    }
LAB_0012f694:
    bVar15 = true;
    if (piVar8 != piVar3) goto LAB_0012f72c;
  }
  else {
    if (lVar9 == 2) {
LAB_0012f672:
      if (*piVar8 != -0x17) {
        piVar8 = piVar8 + 2;
        goto LAB_0012f67b;
      }
      goto LAB_0012f694;
    }
    if (lVar9 == 3) {
      if (*piVar8 != -0x17) {
        piVar8 = piVar8 + 2;
        goto LAB_0012f672;
      }
      goto LAB_0012f694;
    }
  }
  piVar8 = *(int **)(local_58._8_8_ + 0x68);
  piVar3 = *(int **)(local_58._8_8_ + 0x70);
  lVar12 = (long)piVar3 - (long)piVar8;
  for (lVar13 = lVar12 >> 5; 0 < lVar13; lVar13 = lVar13 + -1) {
    piVar11 = piVar8;
    if (*piVar8 == -0x17) goto LAB_0012f725;
    if (piVar8[2] == -0x17) {
      piVar11 = piVar8 + 2;
      goto LAB_0012f725;
    }
    if (piVar8[4] == -0x17) {
      piVar11 = piVar8 + 4;
      goto LAB_0012f725;
    }
    if (piVar8[6] == -0x17) {
      piVar11 = piVar8 + 6;
      goto LAB_0012f725;
    }
    piVar8 = piVar8 + 8;
    lVar12 = lVar12 + -0x20;
  }
  lVar12 = lVar12 >> 3;
  if (lVar12 == 1) {
LAB_0012f709:
    piVar11 = piVar8;
    if (*piVar8 != -0x17) {
      piVar11 = piVar3;
    }
  }
  else if (lVar12 == 2) {
LAB_0012f700:
    piVar11 = piVar8;
    if (*piVar8 != -0x17) {
      piVar8 = piVar8 + 2;
      goto LAB_0012f709;
    }
  }
  else {
    piVar11 = piVar3;
    if ((lVar12 == 3) && (piVar11 = piVar8, *piVar8 != -0x17)) {
      piVar8 = piVar8 + 2;
      goto LAB_0012f700;
    }
  }
LAB_0012f725:
  bVar15 = piVar11 != piVar3;
LAB_0012f72c:
  pbVar2 = &(pMVar5->features_used).exceptions;
  *pbVar2 = (bool)(*pbVar2 | bVar15);
  local_58._8_8_ = (long *)0x0;
  plVar6 = *(long **)(local_68._0_8_ + 0x40);
  *(undefined8 *)(local_68._0_8_ + 0x40) = uVar7;
  local_58._0_8_ = local_68._0_8_;
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 8))();
    local_58._0_8_ = local_68._0_8_;
  }
  local_68._0_8_ = (long *)0x0;
  Module::AppendField(*(Module **)(local_68._8_8_ + 0x18),
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)local_58);
  if (local_58._0_8_ != 0) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  local_58._0_8_ = 0;
  if ((long *)local_58._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._8_8_ + 8))();
  }
  if ((long *)local_68._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  if (param_count > kMaxFunctionParams) {
    PrintError("FuncType param count exceeds maximum value");
    return Result::Error;
  }

  if (result_count > kMaxFunctionResults) {
    PrintError("FuncType result count exceeds maximum value");
    return Result::Error;
  }

  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto func_type = std::make_unique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);

  module_->features_used.simd |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::V128; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::V128; });
  module_->features_used.exceptions |=
      std::any_of(func_type->sig.param_types.begin(),
                  func_type->sig.param_types.end(),
                  [](auto x) { return x == Type::ExnRef; }) ||
      std::any_of(func_type->sig.result_types.begin(),
                  func_type->sig.result_types.end(),
                  [](auto x) { return x == Type::ExnRef; });

  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}